

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O1

void __thiscall
FSingleLumpFont::FixupPalette
          (FSingleLumpFont *this,BYTE *identity,double *luminosity,BYTE *palette,bool rescale,
          PalEntry *out_palette)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  BYTE BVar4;
  long lVar5;
  long lVar6;
  byte *pbVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  *identity = '\0';
  if ((this->super_FFont).ActiveColors < 2) {
    dVar10 = 0.0;
    dVar9 = 100000000.0;
  }
  else {
    pbVar7 = palette + 5;
    dVar9 = 100000000.0;
    lVar6 = 1;
    dVar11 = 0.0;
    do {
      bVar1 = pbVar7[-2];
      bVar2 = pbVar7[-1];
      bVar3 = *pbVar7;
      dVar8 = (double)bVar3 * 0.114 + (double)bVar2 * 0.587 + (double)bVar1 * 0.299;
      BVar4 = FColorMatcher::Pick(&ColorMatcher,(uint)bVar1,(uint)bVar2,(uint)bVar3);
      identity[lVar6] = BVar4;
      luminosity[lVar6] = dVar8;
      out_palette[lVar6].field_0.field_0.r = bVar1;
      out_palette[lVar6].field_0.field_0.g = bVar2;
      out_palette[lVar6].field_0.field_0.b = bVar3;
      out_palette[lVar6].field_0.field_0.a = 0xff;
      dVar10 = dVar8;
      if (dVar8 <= dVar11) {
        dVar10 = dVar11;
      }
      if (dVar9 <= dVar8) {
        dVar8 = dVar9;
      }
      dVar9 = dVar8;
      lVar6 = lVar6 + 1;
      pbVar7 = pbVar7 + 3;
      dVar11 = dVar10;
    } while (lVar6 < (this->super_FFont).ActiveColors);
  }
  (out_palette->field_0).d = 0;
  if (rescale) {
    dVar10 = 1.0 / (dVar10 - dVar9);
  }
  else {
    dVar10 = 0.00392156862745098;
  }
  lVar6 = (long)(this->super_FFont).ActiveColors;
  if (1 < lVar6) {
    lVar5 = 1;
    do {
      luminosity[lVar5] = (luminosity[lVar5] - dVar9) * dVar10;
      lVar5 = lVar5 + 1;
    } while (lVar6 != lVar5);
  }
  return;
}

Assistant:

void FSingleLumpFont::FixupPalette (BYTE *identity, double *luminosity, const BYTE *palette, bool rescale, PalEntry *out_palette)
{
	int i;
	double maxlum = 0.0;
	double minlum = 100000000.0;
	double diver;

	identity[0] = 0;
	palette += 3;	// Skip the transparent color

	for (i = 1; i < ActiveColors; ++i, palette += 3)
	{
		int r = palette[0];
		int g = palette[1];
		int b = palette[2];
		double lum = r*0.299 + g*0.587 + b*0.114;
		identity[i] = ColorMatcher.Pick (r, g, b);
		luminosity[i] = lum;
		out_palette[i].r = r;
		out_palette[i].g = g;
		out_palette[i].b = b;
		out_palette[i].a = 255;
		if (lum > maxlum)
			maxlum = lum;
		if (lum < minlum)
			minlum = lum;
	}
	out_palette[0] = 0;

	if (rescale)
	{
		diver = 1.0 / (maxlum - minlum);
	}
	else
	{
		diver = 1.0 / 255.0;
	}
	for (i = 1; i < ActiveColors; ++i)
	{
		luminosity[i] = (luminosity[i] - minlum) * diver;
	}
}